

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           *this)

{
  Container *pCVar1;
  Container *container;
  Arena *my_arena;
  InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  *this_local;
  Arena *local_48;
  Container *local_28;
  Container *t;
  
  if (((uint)this->ptr_ & 1) == 1) {
    pCVar1 = InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
             ::
             PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                       ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                         *)this);
    local_48 = pCVar1->arena;
  }
  else {
    local_48 = PtrValue<google::protobuf::Arena>(this);
  }
  if (local_48 == (Arena *)0x0) {
    local_28 = (Container *)operator_new(0x28);
    memset(local_28,0,0x28);
    Container::Container(local_28);
  }
  else {
    local_28 = (Container *)
               Arena::AllocateAligned
                         (local_48,(type_info *)
                                   &InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                                    ::Container::typeinfo,0x28);
    memset(local_28,0,0x28);
    Container::Container(local_28);
    Arena::AddListNode(local_48,local_28,
                       arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                      );
  }
  this->ptr_ = (void *)((ulong)local_28 | 1);
  local_28->arena = local_48;
  return &local_28->unknown_fields;
}

Assistant:

GOOGLE_ATTRIBUTE_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    ptr_ = reinterpret_cast<void*>(
        reinterpret_cast<intptr_t>(container) | kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }